

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Suffix_Array.hpp
# Opt level: O0

idx_t CaPS_SA::Suffix_Array<unsigned_int>::LCP_unrolled<8ul>(char *x,char *y)

{
  undefined8 uVar1;
  undefined1 auVar2 [32];
  uint uVar3;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  uint32_t mask;
  __m256i cmp;
  __m256i v2;
  __m256i v1;
  char *in_stack_ffffffffffffff30;
  undefined4 local_b4;
  
  uVar1 = vpcmpeqb_avx512vl(*in_RDI,*in_RSI);
  auVar2 = vpmovm2b_avx512vl(uVar1);
  uVar3 = (uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
          (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
          (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 | (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
          (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 | (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
          (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
          (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 | (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
          (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc | (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd
          | (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
          (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
          (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
          (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
          (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
          (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
          (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
          (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
          (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 | (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19
          | (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
          (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
          (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
          (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
          (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e | (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f;
  if (uVar3 == 0xffffffff) {
    local_b4 = LCP_unrolled<7ul>((char *)in_RSI,in_stack_ffffffffffffff30);
    local_b4 = local_b4 + 0x20;
  }
  else {
    local_b4 = 0;
    for (uVar3 = uVar3 ^ 0xffffffff; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
      local_b4 = local_b4 + 1;
    }
  }
  return local_b4;
}

Assistant:

inline T_idx_ Suffix_Array<T_idx_>::LCP_unrolled(const char* const x, const char* const y)
{
    if constexpr(N == 0)
        return 0;
    else
    {
        const auto v1 = _mm256_loadu_si256(reinterpret_cast<const __m256i*>(x));
        const auto v2 = _mm256_loadu_si256(reinterpret_cast<const __m256i*>(y));
        const auto cmp = _mm256_cmpeq_epi8(v1, v2);
        const auto mask = static_cast<uint32_t>(_mm256_movemask_epi8(cmp));
        if(mask != 0xFFFFFFFF)
            return __builtin_ctz(~mask);

        return 32 + LCP_unrolled<N - 1>(x + 32, y + 32);
    }
}